

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

real3 sdf_tools::flip3<sdf_tools::real3>(real3 *v0,IntFlipMap *map)

{
  char cVar1;
  real3 *prVar2;
  real3 *prVar3;
  anon_class_8_1_3fcf6738 getComp;
  real3 rVar4;
  
  cVar1 = (char)map->_M_elems[0];
  prVar2 = v0;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      prVar2 = (real3 *)&v0->y;
    }
    else {
      prVar2 = (real3 *)&v0->z;
    }
  }
  cVar1 = (char)map->_M_elems[1];
  prVar3 = v0;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      prVar3 = (real3 *)&v0->y;
    }
    else {
      prVar3 = (real3 *)&v0->z;
    }
  }
  cVar1 = (char)map->_M_elems[2];
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      v0 = (real3 *)&v0->y;
    }
    else {
      v0 = (real3 *)&v0->z;
    }
  }
  rVar4.y = prVar3->x;
  rVar4.x = prVar2->x;
  rVar4.z = v0->x;
  return rVar4;
}

Assistant:

inline T flip3(const T& v0, const IntFlipMap& map)
{

    auto getComp = [&](char c)
    {
        if      (c == 0) return v0.x;
        else if (c == 1) return v0.y;
        else             return v0.z;
    };

    return {getComp(map[0]),
            getComp(map[1]),
            getComp(map[2])};
}